

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall BackwardPass::DoByteCodeUpwardExposedUsed(BackwardPass *this)

{
  bool bVar1;
  BOOL BVar2;
  
  if (this->tag == BackwardPhase) {
    BVar2 = Func::HasTry(this->func);
    if ((BVar2 != 0) && (bVar1 = Func::DoOptimizeTry(this->func), bVar1)) {
      return true;
    }
  }
  else if ((this->tag == DeadStorePhase) && ((this->func->field_0x240 & 0x10) != 0)) {
    return true;
  }
  return this->tag == CaptureByteCodeRegUsePhase;
}

Assistant:

bool
BackwardPass::DoByteCodeUpwardExposedUsed() const
{
    return (
        (this->tag == Js::DeadStorePhase && this->func->hasBailout) ||
        (this->tag == Js::BackwardPhase && this->func->HasTry() && this->func->DoOptimizeTry())
#if DBG
        || tag == Js::CaptureByteCodeRegUsePhase
#endif
    );
}